

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  ulong uVar1;
  RawBufferView *pRVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  PrimRef *pPVar6;
  bool bVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  size_t *psVar18;
  ulong uVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  undefined1 auVar25 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar21 [64];
  undefined1 auVar23 [64];
  
  aVar20.m128[2] = INFINITY;
  aVar20._0_8_ = 0x7f8000007f800000;
  aVar20.m128[3] = INFINITY;
  auVar21 = ZEXT1664((undefined1  [16])aVar20);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  aVar22.m128[2] = -INFINITY;
  aVar22._0_8_ = 0xff800000ff800000;
  aVar22.m128[3] = -INFINITY;
  auVar23 = ZEXT1664((undefined1  [16])aVar22);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar22;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar16 = r->_begin;
  sVar15 = __return_storage_ptr__->end;
  aVar26 = aVar20;
  aVar24 = aVar22;
  if (uVar16 < r->_end) {
    uVar1 = itime + 1;
    auVar28._8_4_ = 0x7f800000;
    auVar28._0_8_ = 0x7f8000007f800000;
    auVar28._12_4_ = 0x7f800000;
    auVar29._8_4_ = 0xff800000;
    auVar29._0_8_ = 0xff800000ff800000;
    auVar29._12_4_ = 0xff800000;
    auVar30._8_4_ = 0xddccb9a2;
    auVar30._0_8_ = 0xddccb9a2ddccb9a2;
    auVar30._12_4_ = 0xddccb9a2;
    auVar31._8_4_ = 0x5dccb9a2;
    auVar31._0_8_ = 0x5dccb9a25dccb9a2;
    auVar31._12_4_ = 0x5dccb9a2;
    auVar27 = ZEXT1664((undefined1  [16])aVar20);
    auVar25 = ZEXT1664((undefined1  [16])aVar22);
    do {
      uVar17 = uVar16 & 0xffffffff;
      pBVar3 = (this->super_Points).vertices.items;
      uVar19 = (pBVar3->super_RawBufferView).num;
      auVar32 = auVar29;
      auVar33 = auVar28;
      if (uVar17 < uVar19) {
        pcVar4 = pBVar3[itime].super_RawBufferView.ptr_ofs;
        lVar13 = pBVar3[itime].super_RawBufferView.stride * uVar17;
        auVar34 = *(undefined1 (*) [16])(pcVar4 + lVar13);
        uVar11 = vcmpps_avx512vl(auVar34,auVar30,6);
        uVar12 = vcmpps_avx512vl(auVar34,auVar31,1);
        bVar7 = false;
        if (((byte)((byte)uVar11 & (byte)uVar12) == 0xf) &&
           (0.0 <= *(float *)(pcVar4 + lVar13 + 0xc))) {
          psVar18 = &pBVar3[itime + 1].super_RawBufferView.stride;
          sVar14 = itime;
          do {
            sVar14 = sVar14 + 1;
            bVar7 = itime < sVar14;
            if (itime < sVar14) {
              if (uVar19 <= uVar17) goto LAB_01fb4ebb;
              goto LAB_01fb4ddc;
            }
            pRVar2 = (RawBufferView *)(psVar18 + -2);
            sVar5 = *psVar18;
            auVar34 = *(undefined1 (*) [16])(pRVar2->ptr_ofs + sVar5 * uVar17);
            uVar11 = vcmpps_avx512vl(auVar34,auVar30,6);
            uVar12 = vcmpps_avx512vl(auVar34,auVar31,1);
          } while (((byte)((byte)uVar11 & (byte)uVar12) == 0xf) &&
                  (psVar18 = psVar18 + 7, 0.0 <= *(float *)(pRVar2->ptr_ofs + sVar5 * uVar17 + 0xc))
                  );
        }
        if (!(bool)(uVar17 < uVar19 & bVar7)) goto LAB_01fb4ebb;
LAB_01fb4ddc:
        pcVar4 = pBVar3[uVar1].super_RawBufferView.ptr_ofs;
        lVar13 = pBVar3[uVar1].super_RawBufferView.stride * uVar17;
        auVar34 = *(undefined1 (*) [16])(pcVar4 + lVar13);
        uVar11 = vcmpps_avx512vl(auVar34,auVar30,6);
        uVar12 = vcmpps_avx512vl(auVar34,auVar31,1);
        bVar7 = false;
        if ((byte)((byte)uVar11 & (byte)uVar12) != 0xf) goto LAB_01fb4ebb;
        if (0.0 <= *(float *)(pcVar4 + lVar13 + 0xc)) {
          psVar18 = &pBVar3[itime + 2].super_RawBufferView.stride;
          uVar19 = uVar1;
          do {
            uVar19 = uVar19 + 1;
            if (uVar1 < uVar19) goto LAB_01fb4e77;
            pRVar2 = (RawBufferView *)(psVar18 + -2);
            sVar14 = *psVar18;
            auVar34 = *(undefined1 (*) [16])(pRVar2->ptr_ofs + sVar14 * uVar17);
            uVar11 = vcmpps_avx512vl(auVar34,auVar30,6);
            uVar12 = vcmpps_avx512vl(auVar34,auVar31,1);
          } while (((byte)((byte)uVar11 & (byte)uVar12) == 0xf) &&
                  (psVar18 = psVar18 + 7, 0.0 <= *(float *)(pRVar2->ptr_ofs + sVar14 * uVar17 + 0xc)
                  ));
          if (uVar19 <= uVar1) goto LAB_01fb4ebb;
LAB_01fb4e77:
          pcVar4 = pBVar3[itime].super_RawBufferView.ptr_ofs;
          lVar13 = pBVar3[itime].super_RawBufferView.stride * uVar16;
          auVar34 = *(undefined1 (*) [16])(pcVar4 + lVar13);
          fVar10 = *(float *)(pcVar4 + lVar13 + 0xc) * (this->super_Points).maxRadiusScale;
          auVar33._4_4_ = fVar10;
          auVar33._0_4_ = fVar10;
          auVar33._8_4_ = fVar10;
          auVar33._12_4_ = fVar10;
          auVar33 = vsubps_avx(auVar34,auVar33);
          auVar32._0_4_ = auVar34._0_4_ + fVar10;
          auVar32._4_4_ = auVar34._4_4_ + fVar10;
          auVar32._8_4_ = auVar34._8_4_ + fVar10;
          auVar32._12_4_ = auVar34._12_4_ + fVar10;
          bVar7 = true;
        }
      }
      else {
LAB_01fb4ebb:
        bVar7 = false;
      }
      sVar14 = k;
      if (bVar7) {
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar33,ZEXT416(geomID),0x30);
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar32,ZEXT416((uint)uVar16),0x30);
        auVar33 = vminps_avx(auVar21._0_16_,(undefined1  [16])aVar8);
        auVar21 = ZEXT1664(auVar33);
        auVar33 = vmaxps_avx(auVar23._0_16_,(undefined1  [16])aVar9);
        auVar23 = ZEXT1664(auVar33);
        auVar34._0_4_ = aVar9.x + aVar8.x;
        auVar34._4_4_ = aVar9.y + aVar8.y;
        auVar34._8_4_ = aVar9.z + aVar8.z;
        auVar34._12_4_ = aVar9.field_3.w + aVar8.field_3.w;
        auVar33 = vminps_avx(auVar27._0_16_,auVar34);
        auVar27 = ZEXT1664(auVar33);
        auVar33 = vmaxps_avx(auVar25._0_16_,auVar34);
        auVar25 = ZEXT1664(auVar33);
        sVar15 = sVar15 + 1;
        sVar14 = k + 1;
        pPVar6 = prims->items;
        pPVar6[k].lower.field_0.field_1 = aVar8;
        pPVar6[k].upper.field_0.field_1 = aVar9;
      }
      aVar24 = auVar25._0_16_;
      aVar26 = auVar27._0_16_;
      aVar22 = auVar23._0_16_;
      aVar20 = auVar21._0_16_;
      uVar16 = uVar16 + 1;
      k = sVar14;
    } while (uVar16 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar26;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar24;
  __return_storage_ptr__->end = sVar15;
  return __return_storage_ptr__;
}

Assistant:

__forceinline Vec3ff vertex_safe(size_t i, float time) const
    {
      if (hasMotionBlur()) return vertex(i,time);
      else                 return vertex(i);
    }